

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

bool __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
can_be_inserted(storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag> *this
               ,size_t hash,int constraints)

{
  const_reference pvVar1;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  m_indices_reader lock;
  int constraints_local;
  size_t hash_local;
  storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag> *this_local;
  
  lock._12_4_ = constraints;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_38,&this->m_indices_mutex);
  local_3c = 0;
  do {
    if (local_3c == this->m_size) {
      this_local._7_1_ = true;
LAB_0020de85:
      std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_38);
      return this_local._7_1_;
    }
    pvVar1 = std::
             vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ::operator[](&this->m_data,(long)local_3c);
    if (pvVar1->remaining_constraints == lock._12_4_) {
      pvVar1 = std::
               vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ::operator[](&this->m_data,(long)local_3c);
      if (pvVar1->hash == hash) {
        this_local._7_1_ = false;
        goto LAB_0020de85;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool can_be_inserted(const std::size_t hash, const int constraints) const
      noexcept
    {
        m_indices_reader lock(m_indices_mutex);

        for (int i = 0; i != m_size; ++i)
            if (m_data[i].remaining_constraints == constraints &&
                m_data[i].hash == hash)
                return false;

        return true;
    }